

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void scrollCallback(GLFWwindow *window,double xoffset,double yoffset)

{
  state.fovy = (float)(-(uint)(90.0 < (float)((double)state.fovy - yoffset)) & 0x42b20000);
  return;
}

Assistant:

void scrollCallback(GLFWwindow *window, double xoffset, double yoffset) {
  // Doubt xoffset will be produced
  state.fovy -= yoffset;
  if (state.fovy > 90)
    state.fovy = 89.0f;
  else
    state.fovy = 0.0f;
}